

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O3

QString * __thiscall QIODevice::errorString(QString *__return_storage_ptr__,QIODevice *this)

{
  QIODevicePrivate *pQVar1;
  long lVar2;
  Data *pDVar3;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
           super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
           super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
  lVar2 = *(qsizetype *)((long)&(pQVar1->errorString).d + 0x10);
  if (lVar2 == 0) {
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"Unknown error";
    QString::fromLatin1(&local_38,(QString *)0xd,ba);
    (__return_storage_ptr__->d).d = local_38.d.d;
    (__return_storage_ptr__->d).ptr = local_38.d.ptr;
    (__return_storage_ptr__->d).size = local_38.d.size;
  }
  else {
    pDVar3 = (pQVar1->errorString).d.d;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = *(char16_t **)((long)&(pQVar1->errorString).d + 8);
    (__return_storage_ptr__->d).size = lVar2;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QIODevice::errorString() const
{
    Q_D(const QIODevice);
    if (d->errorString.isEmpty()) {
#ifdef QT_NO_QOBJECT
        return QLatin1StringView(QT_TRANSLATE_NOOP(QIODevice, "Unknown error"));
#else
        return tr("Unknown error");
#endif
    }
    return d->errorString;
}